

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O2

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::
GenerateAttributesEncoder
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this,
          int32_t att_id)

{
  pointer pAVar1;
  Mesh *pMVar2;
  CornerTable *pCVar3;
  TraversalObserver traversal_observer;
  int32_t iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  MeshTraversalMethod MVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Head_base<0UL,_draco::PointsSequencer_*,_false> this_00;
  undefined4 extraout_var_03;
  tuple<draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_> this_01;
  undefined4 extraout_var_04;
  uint uVar9;
  MeshTraversalMethod *pMVar10;
  long lVar11;
  MeshAttributeIndicesEncodingData *pMVar12;
  int32_t att_data_id;
  __uniq_ptr_impl<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> local_108;
  MeshAttributeIndicesEncodingData *local_100;
  __uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_> local_f8
  ;
  long local_f0;
  CornerTable *local_e8;
  MeshAttributeIndicesEncodingData *pMStack_e0;
  Mesh *local_d8;
  MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
  *pMStack_d0;
  AttTraverser att_traverser;
  
  if ((this->use_single_connectivity_ == true) &&
     (iVar6 = (*(this->super_MeshEdgebreakerEncoderImplInterface).
                _vptr_MeshEdgebreakerEncoderImplInterface[10])(this),
     0 < (int)((ulong)(*(long *)(CONCAT44(extraout_var,iVar6) + 0x18) -
                      *(long *)(CONCAT44(extraout_var,iVar6) + 0x10)) >> 3))) {
    iVar6 = (*(this->super_MeshEdgebreakerEncoderImplInterface).
              _vptr_MeshEdgebreakerEncoderImplInterface[10])(this);
    AttributesEncoder::AddAttributeId
              ((AttributesEncoder *)**(undefined8 **)(CONCAT44(extraout_var_00,iVar6) + 0x10),att_id
              );
    return true;
  }
  iVar6 = (*(this->super_MeshEdgebreakerEncoderImplInterface).
            _vptr_MeshEdgebreakerEncoderImplInterface[10])(this);
  iVar6 = *(int *)(*(long *)(*(long *)(CONCAT44(extraout_var_01,iVar6) + 0x70) + 0xa8) +
                  (long)att_id * 4);
  iVar7 = (*(this->super_MeshEdgebreakerEncoderImplInterface).
            _vptr_MeshEdgebreakerEncoderImplInterface[10])(this);
  pMVar12 = *(MeshAttributeIndicesEncodingData **)
             (*(long *)(*(long *)(CONCAT44(extraout_var_02,iVar7) + 8) + 0x10) + (long)att_id * 8);
  att_data_id = -1;
  pAVar1 = (this->attribute_data_).
           super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = 0;
  while ((uVar5 = att_data_id,
         (ulong)uVar9 <
         (ulong)(((long)(this->attribute_data_).
                        super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) / 0x130) &&
         (uVar5 = uVar9, pAVar1[uVar9].attribute_index != att_id))) {
    uVar9 = uVar9 + 1;
  }
  att_data_id = uVar5;
  iVar4 = att_data_id;
  lVar11 = (long)att_data_id;
  if (this->use_single_connectivity_ == false) {
    if ((iVar6 == 0) || (*(MeshTraversalMethod *)(pMVar12 + 1) == MESH_TRAVERSAL_DEPTH_FIRST)) {
      if (*(MeshTraversalMethod *)(pMVar12 + 1) == MESH_TRAVERSAL_DEPTH_FIRST) goto LAB_001341f0;
    }
    else if ((iVar6 != 1) || (pAVar1[lVar11].connectivity_data.no_interior_seams_ == false)) {
      local_f0 = lVar11 * 0x130;
      att_traverser.
      super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      ._vptr_TraverserBase._0_4_ = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::_M_fill_assign
                (&pAVar1[lVar11].encoding_data.vertex_to_encoded_attribute_value_index_map,
                 (long)(int)((ulong)((long)pAVar1[lVar11].connectivity_data.
                                           vertex_to_attribute_entry_id_map_.
                                           super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    *(long *)&pAVar1[lVar11].connectivity_data.
                                              vertex_to_attribute_entry_id_map_.
                                              super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                              ._M_impl.super__Vector_impl_data) >> 2),
                 (value_type_conflict1 *)&att_traverser);
      this_00._M_head_impl = (PointsSequencer *)operator_new(0xc0);
      local_100 = &pAVar1[lVar11].encoding_data;
      MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
      ::MeshTraversalSequencer
                ((MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
                  *)this_00._M_head_impl,this->mesh_,&pAVar1[lVar11].encoding_data);
      pMVar2 = this->mesh_;
      DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      ::DepthFirstTraverser(&att_traverser);
      local_e8 = (CornerTable *)
                 ((long)&(pAVar1->connectivity_data).is_edge_on_seam_.
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + local_f0);
      pMStack_e0 = local_100;
      traversal_observer.encoding_data_ = local_100;
      traversal_observer.att_connectivity_ = local_e8;
      traversal_observer.mesh_ = pMVar2;
      traversal_observer.sequencer_ = this_00._M_head_impl;
      local_d8 = pMVar2;
      pMStack_d0 = (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
                    *)this_00._M_head_impl;
      TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      ::Init(&att_traverser.
              super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
             ,local_e8,traversal_observer);
      ((MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
        *)this_00._M_head_impl)->corner_order_ = &this->processed_connectivity_corners_;
      DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      ::operator=(&((MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
                     *)this_00._M_head_impl)->traverser_,&att_traverser);
      DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      ::~DepthFirstTraverser(&att_traverser);
      MVar8 = MESH_TRAVERSAL_DEPTH_FIRST;
      goto LAB_00134232;
    }
    pCVar3 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    att_traverser.
    super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
    ._vptr_TraverserBase._0_4_ = 0xffffffff;
    local_100 = pMVar12;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&pAVar1[lVar11].encoding_data.vertex_to_encoded_attribute_value_index_map,
               (long)(int)((ulong)((long)(pCVar3->vertex_corners_).vector_.
                                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  *(long *)&(pCVar3->vertex_corners_).vector_.
                                            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                  ) >> 2),(value_type_conflict1 *)&att_traverser);
    (this->attribute_data_).
    super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
    ._M_impl.super__Vector_impl_data._M_start[lVar11].is_connectivity_used = false;
    pMVar12 = local_100;
  }
LAB_001341f0:
  iVar6 = (*(this->super_MeshEdgebreakerEncoderImplInterface).
            _vptr_MeshEdgebreakerEncoderImplInterface[10])(this);
  iVar6 = EncoderOptionsBase<int>::GetSpeed
                    (*(EncoderOptionsBase<int> **)(CONCAT44(extraout_var_03,iVar6) + 0x60));
  if (((iVar6 == 0) && (*(MeshTraversalMethod *)(pMVar12 + 1) == MESH_TRAVERSAL_DEPTH_FIRST)) &&
     ((this->use_single_connectivity_ != true ||
      ((int)((ulong)((long)(this->mesh_->super_PointCloud).attributes_.
                           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->mesh_->super_PointCloud).attributes_.
                          super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) < 2)))) {
    CreateVertexTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>
              ((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *)
               &att_traverser,(MeshAttributeIndicesEncodingData *)this);
    this_00._M_head_impl._4_4_ =
         att_traverser.
         super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
         ._vptr_TraverserBase._4_4_;
    this_00._M_head_impl._0_4_ =
         att_traverser.
         super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
         ._vptr_TraverserBase._0_4_;
    MVar8 = MESH_TRAVERSAL_PREDICTION_DEGREE;
  }
  else {
    CreateVertexTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>
              ((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *)
               &att_traverser,(MeshAttributeIndicesEncodingData *)this);
    this_00._M_head_impl._4_4_ =
         att_traverser.
         super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
         ._vptr_TraverserBase._4_4_;
    this_00._M_head_impl._0_4_ =
         att_traverser.
         super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
         ._vptr_TraverserBase._0_4_;
    MVar8 = MESH_TRAVERSAL_DEPTH_FIRST;
  }
  if (this_00._M_head_impl == (PointsSequencer *)0x0) {
    return false;
  }
LAB_00134232:
  pMVar10 = &(this->attribute_data_).
             super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar11].traversal_method;
  if (iVar4 == -1) {
    pMVar10 = &this->pos_traversal_method_;
  }
  *pMVar10 = MVar8;
  this_01.
  super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
  .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
       )operator_new(0xa8);
  local_108._M_t.
  super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>.
  super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl =
       (tuple<draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
       (tuple<draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
       this_00._M_head_impl;
  SequentialAttributeEncodersController::SequentialAttributeEncodersController
            ((SequentialAttributeEncodersController *)
             this_01.
             super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
             .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl,
             (unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
             &local_108,att_id);
  if ((_Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
      local_108._M_t.
      super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
      .super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl != (PointsSequencer *)0x0
     ) {
    (**(code **)(*(long *)local_108._M_t.
                          super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
                          .super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl + 8))
              ();
  }
  local_108._M_t.
  super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>.
  super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl =
       (tuple<draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
       (_Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)0x0
  ;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->attribute_encoder_to_data_id_map_,&att_data_id);
  iVar6 = (*(this->super_MeshEdgebreakerEncoderImplInterface).
            _vptr_MeshEdgebreakerEncoderImplInterface[10])(this);
  local_f8._M_t.
  super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
  .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
       (tuple<draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>)
       (tuple<draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>)
       this_01.
       super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
       .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl;
  PointCloudEncoder::AddAttributesEncoder
            ((PointCloudEncoder *)CONCAT44(extraout_var_04,iVar6),
             (unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_> *
             )&local_f8);
  if ((_Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>)
      local_f8._M_t.
      super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
      .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl !=
      (AttributesEncoder *)0x0) {
    (**(code **)(*(long *)local_f8._M_t.
                          super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                          .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl + 8
                ))();
  }
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::GenerateAttributesEncoder(
    int32_t att_id) {
  // For now, either create one encoder for each attribute or use a single
  // encoder for all attributes. Ideally we can share the same encoder for
  // a sub-set of attributes with the same connectivity (this is especially true
  // for per-vertex attributes).
  if (use_single_connectivity_ && GetEncoder()->num_attributes_encoders() > 0) {
    // We are using single connectivity and we already have an attribute
    // encoder. Add the attribute to the encoder and return.
    GetEncoder()->attributes_encoder(0)->AddAttributeId(att_id);
    return true;
  }
  const int32_t element_type =
      GetEncoder()->mesh()->GetAttributeElementType(att_id);
  const PointAttribute *const att =
      GetEncoder()->point_cloud()->attribute(att_id);
  int32_t att_data_id = -1;
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    if (attribute_data_[i].attribute_index == att_id) {
      att_data_id = i;
      break;
    }
  }
  MeshTraversalMethod traversal_method = MESH_TRAVERSAL_DEPTH_FIRST;
  std::unique_ptr<PointsSequencer> sequencer;
  if (use_single_connectivity_ ||
      att->attribute_type() == GeometryAttribute::POSITION ||
      element_type == MESH_VERTEX_ATTRIBUTE ||
      (element_type == MESH_CORNER_ATTRIBUTE &&
       attribute_data_[att_data_id].connectivity_data.no_interior_seams())) {
    // Per-vertex attribute reached, use the basic corner table to traverse the
    // mesh.
    MeshAttributeIndicesEncodingData *encoding_data;
    if (use_single_connectivity_ ||
        att->attribute_type() == GeometryAttribute::POSITION) {
      encoding_data = &pos_encoding_data_;
    } else {
      encoding_data = &attribute_data_[att_data_id].encoding_data;

      // Ensure we use the correct number of vertices in the encoding data.
      encoding_data->vertex_to_encoded_attribute_value_index_map.assign(
          corner_table_->num_vertices(), -1);

      // Mark the attribute specific connectivity data as not used as we use the
      // position attribute connectivity data.
      attribute_data_[att_data_id].is_connectivity_used = false;
    }

    if (GetEncoder()->options()->GetSpeed() == 0 &&
        att->attribute_type() == GeometryAttribute::POSITION) {
      traversal_method = MESH_TRAVERSAL_PREDICTION_DEGREE;
      if (use_single_connectivity_ && mesh_->num_attributes() > 1) {
        // Make sure we don't use the prediction degree traversal when we encode
        // multiple attributes using the same connectivity.
        // TODO(ostava): We should investigate this and see if the prediction
        // degree can be actually used efficiently for non-position attributes.
        traversal_method = MESH_TRAVERSAL_DEPTH_FIRST;
      }
    }
    // Defining sequencer via a traversal scheme.
    if (traversal_method == MESH_TRAVERSAL_PREDICTION_DEGREE) {
      typedef MeshAttributeIndicesEncodingObserver<CornerTable> AttObserver;
      typedef MaxPredictionDegreeTraverser<CornerTable, AttObserver>
          AttTraverser;
      sequencer = CreateVertexTraversalSequencer<AttTraverser>(encoding_data);
    } else if (traversal_method == MESH_TRAVERSAL_DEPTH_FIRST) {
      typedef MeshAttributeIndicesEncodingObserver<CornerTable> AttObserver;
      typedef DepthFirstTraverser<CornerTable, AttObserver> AttTraverser;
      sequencer = CreateVertexTraversalSequencer<AttTraverser>(encoding_data);
    }
  } else {
    // Per-corner attribute encoder.
    typedef MeshAttributeIndicesEncodingObserver<MeshAttributeCornerTable>
        AttObserver;
    typedef DepthFirstTraverser<MeshAttributeCornerTable, AttObserver>
        AttTraverser;

    MeshAttributeIndicesEncodingData *const encoding_data =
        &attribute_data_[att_data_id].encoding_data;
    const MeshAttributeCornerTable *const corner_table =
        &attribute_data_[att_data_id].connectivity_data;

    // Ensure we use the correct number of vertices in the encoding data.
    attribute_data_[att_data_id]
        .encoding_data.vertex_to_encoded_attribute_value_index_map.assign(
            attribute_data_[att_data_id].connectivity_data.num_vertices(), -1);

    std::unique_ptr<MeshTraversalSequencer<AttTraverser>> traversal_sequencer(
        new MeshTraversalSequencer<AttTraverser>(mesh_, encoding_data));

    AttObserver att_observer(corner_table, mesh_, traversal_sequencer.get(),
                             encoding_data);

    AttTraverser att_traverser;
    att_traverser.Init(corner_table, att_observer);

    // Set order of corners to simulate the corner order of the decoder.
    traversal_sequencer->SetCornerOrder(processed_connectivity_corners_);
    traversal_sequencer->SetTraverser(att_traverser);
    sequencer = std::move(traversal_sequencer);
  }

  if (!sequencer) {
    return false;
  }

  if (att_data_id == -1) {
    pos_traversal_method_ = traversal_method;
  } else {
    attribute_data_[att_data_id].traversal_method = traversal_method;
  }

  std::unique_ptr<SequentialAttributeEncodersController> att_controller(
      new SequentialAttributeEncodersController(std::move(sequencer), att_id));

  // Update the mapping between the encoder id and the attribute data id.
  // This will be used by the decoder to select the appropriate attribute
  // decoder and the correct connectivity.
  attribute_encoder_to_data_id_map_.push_back(att_data_id);
  GetEncoder()->AddAttributesEncoder(std::move(att_controller));
  return true;
}